

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

double __thiscall Imath_2_5::Matrix44<double>::minorOf(Matrix44<double> *this,int r,int c)

{
  int in_EDX;
  int in_ESI;
  long in_RDI;
  double dVar1;
  Matrix33<double> working;
  int c2;
  int c1;
  int c0;
  int r2;
  int r1;
  int r0;
  Matrix33<double> local_70;
  int local_28;
  int local_24;
  uint local_20;
  int local_1c;
  int local_18;
  uint local_14;
  
  local_14 = (uint)(in_ESI < 1);
  local_18 = (in_ESI < 2) + 1;
  local_1c = (in_ESI < 3) + 2;
  local_20 = (uint)(in_EDX < 1);
  local_24 = (in_EDX < 2) + 1;
  local_28 = (in_EDX < 3) + 2;
  Matrix33<double>::Matrix33
            (&local_70,*(double *)(in_RDI + (long)(int)local_14 * 0x20 + (long)(int)local_20 * 8),
             *(double *)(in_RDI + (long)local_18 * 0x20 + (long)(int)local_20 * 8),
             *(double *)(in_RDI + (long)local_1c * 0x20 + (long)(int)local_20 * 8),
             *(double *)(in_RDI + (long)(int)local_14 * 0x20 + (long)local_24 * 8),
             *(double *)(in_RDI + (long)local_18 * 0x20 + (long)local_24 * 8),
             *(double *)(in_RDI + (long)local_1c * 0x20 + (long)local_24 * 8),
             *(double *)(in_RDI + (long)(int)local_14 * 0x20 + (long)local_28 * 8),
             *(double *)(in_RDI + (long)local_18 * 0x20 + (long)local_28 * 8),
             *(double *)(in_RDI + (long)local_1c * 0x20 + (long)local_28 * 8));
  dVar1 = Matrix33<double>::determinant(&local_70);
  return dVar1;
}

Assistant:

inline T
Matrix44<T>::minorOf (const int r, const int c) const
{
    int r0 = 0 + (r < 1 ? 1 : 0);
    int r1 = 1 + (r < 2 ? 1 : 0);
    int r2 = 2 + (r < 3 ? 1 : 0);
    int c0 = 0 + (c < 1 ? 1 : 0);
    int c1 = 1 + (c < 2 ? 1 : 0);
    int c2 = 2 + (c < 3 ? 1 : 0);

    Matrix33<T> working (x[r0][c0],x[r1][c0],x[r2][c0],
                         x[r0][c1],x[r1][c1],x[r2][c1],
                         x[r0][c2],x[r1][c2],x[r2][c2]);

    return working.determinant();
}